

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImPool<ImGuiTable>::Remove(ImPool<ImGuiTable> *this,ImGuiID key,ImPoolIdx idx)

{
  ImGuiTable *pIVar1;
  int in_EDX;
  ImVector<ImGuiTable> *in_RDI;
  int in_stack_00000008;
  ImGuiID in_stack_0000000c;
  ImGuiStorage *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ImGuiID IVar2;
  
  ImVector<ImGuiTable>::operator[](in_RDI,in_EDX);
  ImGuiTable::~ImGuiTable
            ((ImGuiTable *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  IVar2 = in_RDI[2].Size;
  pIVar1 = ImVector<ImGuiTable>::operator[](in_RDI,in_EDX);
  pIVar1->ID = IVar2;
  in_RDI[2].Size = in_EDX;
  ImGuiStorage::SetInt(in_stack_00000010,in_stack_0000000c,in_stack_00000008);
  return;
}

Assistant:

void        Remove(ImGuiID key, ImPoolIdx idx)  { Buf[idx].~T(); *(int*)&Buf[idx] = FreeIdx; FreeIdx = idx; Map.SetInt(key, -1); }